

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit.hpp
# Opt level: O0

void __thiscall boost::unit_test::test_suite::~test_suite(test_suite *this)

{
  test_unit *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  
  *(undefined ***)in_RDI = &PTR__test_suite_00301dc0;
  std::
  multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~multimap((multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               *)0x248fbd);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(unaff_retaddr);
  test_unit::~test_unit(in_RDI);
  return;
}

Assistant:

virtual         ~test_suite() {}